

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_comment(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos23;
  int yypos23;
  int yythunkpos21;
  int yypos21;
  int yythunkpos18;
  int yypos18;
  int yythunkpos15;
  int yypos15;
  int yythunkpos12;
  int yypos12;
  int yythunkpos9;
  int yypos9;
  int yythunkpos6;
  int yypos6;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar5 = yymatchString(G,"#`[");
  if (iVar5 == 0) {
LAB_00125d3f:
    G->pos = iVar7;
    G->thunkpos = iVar3;
    iVar5 = yymatchString(G,"#`(");
    if (iVar5 != 0) {
      do {
        iVar5 = G->pos;
        iVar4 = G->thunkpos;
        iVar6 = yymatchClass(G,(uchar *)anon_var_dwarf_3c13,"^)");
      } while (iVar6 != 0);
      G->pos = iVar5;
      G->thunkpos = iVar4;
      iVar5 = yymatchChar(G,0x29);
      if (iVar5 != 0) goto LAB_00126006;
    }
    G->pos = iVar7;
    G->thunkpos = iVar3;
    iVar5 = yymatchString(G,anon_var_dwarf_3c2b);
    if (iVar5 != 0) {
      do {
        iVar5 = G->pos;
        iVar4 = G->thunkpos;
        iVar6 = yymatchClass(G,(uchar *)anon_var_dwarf_3c37,anon_var_dwarf_3c43);
      } while (iVar6 != 0);
      G->pos = iVar5;
      G->thunkpos = iVar4;
      iVar5 = yymatchString(G,anon_var_dwarf_3c4f);
      if (iVar5 != 0) goto LAB_00126006;
    }
    G->pos = iVar7;
    G->thunkpos = iVar3;
    iVar5 = yymatchString(G,anon_var_dwarf_3c5b);
    if (iVar5 != 0) {
      do {
        iVar5 = G->pos;
        iVar4 = G->thunkpos;
        iVar6 = yymatchClass(G,(uchar *)anon_var_dwarf_3c67,anon_var_dwarf_3c43);
      } while (iVar6 != 0);
      G->pos = iVar5;
      G->thunkpos = iVar4;
      iVar5 = yymatchString(G,anon_var_dwarf_3c73);
      if (iVar5 != 0) goto LAB_00126006;
    }
    G->pos = iVar7;
    G->thunkpos = iVar3;
    iVar5 = yymatchString(G,anon_var_dwarf_3c7f);
    if (iVar5 != 0) {
      do {
        iVar5 = G->pos;
        iVar4 = G->thunkpos;
        iVar6 = yymatchClass(G,(uchar *)anon_var_dwarf_3c8b,anon_var_dwarf_3c43);
      } while (iVar6 != 0);
      G->pos = iVar5;
      G->thunkpos = iVar4;
      iVar5 = yymatchString(G,anon_var_dwarf_3c97);
      if (iVar5 != 0) goto LAB_00126006;
    }
    G->pos = iVar7;
    G->thunkpos = iVar3;
    iVar7 = yymatchChar(G,0x23);
    if (iVar7 != 0) {
      do {
        iVar7 = G->pos;
        iVar3 = G->thunkpos;
        iVar5 = yymatchClass(G,(uchar *)anon_var_dwarf_1a1e,"^\\n");
      } while (iVar5 != 0);
      G->pos = iVar7;
      G->thunkpos = iVar3;
      iVar7 = yy_end_of_line(G);
      if (iVar7 != 0) goto LAB_00126006;
    }
    G->pos = iVar1;
    G->thunkpos = iVar2;
    G_local._4_4_ = 0;
  }
  else {
    do {
      iVar5 = G->pos;
      iVar4 = G->thunkpos;
      iVar6 = yymatchClass(G,(uchar *)anon_var_dwarf_2287,"^\\]");
    } while (iVar6 != 0);
    G->pos = iVar5;
    G->thunkpos = iVar4;
    iVar5 = yymatchChar(G,0x5d);
    if (iVar5 == 0) goto LAB_00125d3f;
LAB_00126006:
    G_local._4_4_ = 1;
  }
  return G_local._4_4_;
}

Assistant:

YY_RULE(int) yy_comment(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "comment"));

  {  int yypos6= G->pos, yythunkpos6= G->thunkpos;  if (!yymatchString(G, "#`[")) goto l7;

  l8:;	
  {  int yypos9= G->pos, yythunkpos9= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\337\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^\\]")) goto l9;
  goto l8;
  l9:;	  G->pos= yypos9; G->thunkpos= yythunkpos9;
  }  if (!yymatchChar(G, ']')) goto l7;
  goto l6;
  l7:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchString(G, "#`(")) goto l10;

  l11:;	
  {  int yypos12= G->pos, yythunkpos12= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\375\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^)")) goto l12;
  goto l11;
  l12:;	  G->pos= yypos12; G->thunkpos= yythunkpos12;
  }  if (!yymatchChar(G, ')')) goto l10;
  goto l6;
  l10:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchString(G, "#`（")) goto l13;

  l14:;	
  {  int yypos15= G->pos, yythunkpos15= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\375\377\377\377\377\377\357\377\377\377\377\377\177\377\377", "^\377\377\377")) goto l15;
  goto l14;
  l15:;	  G->pos= yypos15; G->thunkpos= yythunkpos15;
  }  if (!yymatchString(G, "）")) goto l13;
  goto l6;
  l13:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchString(G, "#`『")) goto l16;

  l17:;	
  {  int yypos18= G->pos, yythunkpos18= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\376\177\377\377\377\377\377\377\377\377\377\377\367\377\377\377", "^\377\377\377")) goto l18;
  goto l17;
  l18:;	  G->pos= yypos18; G->thunkpos= yythunkpos18;
  }  if (!yymatchString(G, "』")) goto l16;
  goto l6;
  l16:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchString(G, "#`《")) goto l19;

  l20:;	
  {  int yypos21= G->pos, yythunkpos21= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\376\367\377\377\377\377\377\377\377\377\377\377\367\377\377\377", "^\377\377\377")) goto l21;
  goto l20;
  l21:;	  G->pos= yypos21; G->thunkpos= yythunkpos21;
  }  if (!yymatchString(G, "》")) goto l19;
  goto l6;
  l19:;	  G->pos= yypos6; G->thunkpos= yythunkpos6;  if (!yymatchChar(G, '#')) goto l5;

  l22:;	
  {  int yypos23= G->pos, yythunkpos23= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\377\373\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377\377", "^\\n")) goto l23;
  goto l22;
  l23:;	  G->pos= yypos23; G->thunkpos= yythunkpos23;
  }  if (!yy_end_of_line(G))  goto l5;

  }
  l6:;	  yyprintf((stderr, "  ok   comment"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l5:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "comment"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}